

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorPool::DeferredValidation::DeferredValidation
          (DeferredValidation *this,DescriptorPool *pool,ErrorCollector *error_collector)

{
  FileDescriptorProto *pFVar1;
  
  internal::ThreadSafeArena::ThreadSafeArena(&(this->arena_).impl_,this->initial_buffer_,0x200);
  pFVar1 = (FileDescriptorProto *)
           Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>(&this->arena_);
  this->first_proto_ = pFVar1;
  this->pool_ = pool;
  this->error_collector_ = error_collector;
  (this->lifetimes_info_map_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this->lifetimes_info_map_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  (((HeapOrSoo *)
   ((long)&(this->lifetimes_info_map_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x647f40;
  return;
}

Assistant:

DeferredValidation(const DescriptorPool* pool,
                     ErrorCollector* error_collector)
      : pool_(pool), error_collector_(error_collector) {}